

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDU_Factory.cpp
# Opt level: O2

unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_> __thiscall
KDIS::UTILS::PDU_Factory::applyFilters(PDU_Factory *this,Header *H)

{
  _func_int **pp_Var1;
  char cVar2;
  _func_int **in_RDX;
  _func_int **pp_Var3;
  
  pp_Var3 = *(_func_int ***)&(H->super_Header6).m_ui8ProtocolVersion;
  pp_Var1 = (H->super_Header6).m_TimeStamp.super_DataTypeBase._vptr_DataTypeBase;
  do {
    if (pp_Var3 == pp_Var1) goto LAB_00125c40;
    cVar2 = (**(code **)(*(long *)*pp_Var3 + 0x18))();
    pp_Var3 = pp_Var3 + 1;
  } while (cVar2 != '\0');
  if (in_RDX != (_func_int **)0x0) {
    (**(code **)(*in_RDX + 8))();
  }
  in_RDX = (_func_int **)0x0;
LAB_00125c40:
  this->_vptr_PDU_Factory = in_RDX;
  return (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>)
         (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>)
         this;
}

Assistant:

unique_ptr<Header> PDU_Factory::applyFilters( Header * H )
{
    // Test all the filters
    vector<PDU_Factory_Filter*>::const_iterator citr = m_vFilters.begin();
    vector<PDU_Factory_Filter*>::const_iterator citrEnd = m_vFilters.end();

    for( ; citr != citrEnd; ++citr )
    {
        if( !( *citr )->ApplyFilter( H ) )
        {
            // The PDU failed a test so free the memory and return NULL.
            delete H;
            return unique_ptr<Header>();
        }
    }

    return unique_ptr<Header>( H );
}